

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::util_changeCoeff(HModel *this,int row,int col,double newval)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n");
  std::ostream::flush();
  lVar8 = (long)col;
  piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar2[lVar8];
  iVar1 = piVar2[lVar8 + 1];
  iVar4 = -1;
  if (iVar5 < iVar1) {
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar5;
    do {
      iVar4 = iVar5;
      if (*piVar6 == row) break;
      iVar5 = iVar5 + 1;
      piVar6 = piVar6 + 1;
      iVar4 = -1;
    } while (iVar1 != iVar5);
  }
  if (iVar4 < 0) {
    iVar5 = piVar2[this->numCol];
    lVar7 = (long)iVar5;
    std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,lVar7 + 1U);
    std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,lVar7 + 1U);
    if (col < this->numCol) {
      piVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar6 = piVar2 + lVar8 + 1;
        *piVar6 = *piVar6 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->numCol);
    }
    iVar4 = iVar1;
    if (iVar1 < iVar5) {
      piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar2[lVar7] = piVar2[lVar7 + -1];
        pdVar3[lVar7] = pdVar3[lVar7 + -1];
        lVar7 = lVar7 + -1;
      } while (iVar1 < lVar7);
    }
  }
  (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start[iVar4] = newval;
  mlFg_Update(this,this->mlFg_action_NewRows);
  return;
}

Assistant:

void HModel::util_changeCoeff(int row, int col, const double newval) {
  assert(row >= 0 && row < numRow);
  assert(col >= 0 && col < numCol);
#ifdef JAJH_dev
  printf("Called model.util_changeCoeff(row=%d, col=%d, newval=%g)\n", row, col, newval);cout << flush;
#endif
  //  printf("\n\nCalled model.util_changeCoeff(row=%d, col=%d, newval=%g)\n\n", row, col, newval);cout << flush;

  //  util_reportModel();
  int cg_el = -1;
  for (int el=Astart[col]; el < Astart[col+1]; el++) {
  //    printf("Column %4d: Element %4d is row %4d. Is it %4d?\n", col, el, Aindex[el], row);
    if (Aindex[el] == row) {
      cg_el = el;
      break;
    }
  }
  if (cg_el < 0) {
  //    printf("model.util_changeCoeff: Cannot find row %d in column %d\n", row, col);
    cg_el = Astart[col+1];
    int nwNnonz = Astart[numCol] + 1;
    //    printf("model.util_changeCoeff: Increasing Nnonz from %d to %d\n", Astart[numCol], nwNnonz);
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);
    for (int i=col+1; i<=numCol; i++) Astart[i]++;
    for (int el=nwNnonz-1; el>cg_el; el--) {
      Aindex[el] = Aindex[el-1];
      Avalue[el] = Avalue[el-1];
    }
  }    
  Avalue[cg_el] = newval;

  //Deduce the consequences of a changed element
  //ToDo: Can do something more intelligent if element is in nonbasic column. Otherwise, treat it as if 
  mlFg_Update(mlFg_action_NewRows);
  //  util_reportModel();

}